

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          string_view_type *key)

{
  byte bVar1;
  object *poVar2;
  iterator iVar3;
  key_not_found *this_00;
  code *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  
  for (; bVar1 = (byte)*(object_storage *)this & 0xf, bVar1 == 9;
      this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)((long)this + 8))
  {
  }
  if (bVar1 == 0xd) {
    poVar2 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
             value_abi_cxx11_((object_storage *)this);
    iVar3 = sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
            ::find(poVar2,key);
    poVar2 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
             value_abi_cxx11_((object_storage *)this);
    if (iVar3._M_current !=
        (poVar2->members_).
        super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return &(iVar3._M_current)->value_;
    }
  }
  else if (bVar1 != 4) {
    this_00 = (key_not_found *)__cxa_allocate_exception(0x58);
    not_an_object::not_an_object<char>((not_an_object *)this_00,key->_M_str,key->_M_len);
    ppuVar5 = &not_an_object::typeinfo;
    pcVar4 = not_an_object::~not_an_object;
    goto LAB_001ced38;
  }
  this_00 = (key_not_found *)__cxa_allocate_exception(0x58);
  key_not_found::key_not_found<char>(this_00,key->_M_str,key->_M_len);
  ppuVar5 = &key_not_found::typeinfo;
  pcVar4 = key_not_found::~key_not_found;
LAB_001ced38:
  __cxa_throw(this_00,ppuVar5,pcVar4);
}

Assistant:

basic_json& at(const string_view_type& key)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    JSONCONS_THROW(key_not_found(key.data(),key.length()));
                case json_storage_kind::object:
                {
                    auto it = cast<object_storage>().value().find(key);
                    if (it == cast<object_storage>().value().end())
                    {
                        JSONCONS_THROW(key_not_found(key.data(),key.length()));
                    }
                    return (*it).value();
                }
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().at(key);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }